

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O0

void __thiscall BlockFilter::Unserialize<DataStream>(BlockFilter *this,DataStream *s)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 *in_RDI;
  long in_FS_OFFSET;
  Params params;
  uint8_t filter_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  GCSFilter *in_stack_fffffffffffffee8;
  uint256 *in_stack_fffffffffffffef0;
  io_errc __e;
  DataStream *in_stack_fffffffffffffef8;
  GCSFilter *this_00;
  BlockFilter *in_stack_ffffffffffffff00;
  char *pcVar4;
  undefined1 in_stack_ffffffffffffff67;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  Params *in_stack_ffffffffffffff70;
  GCSFilter *in_stack_ffffffffffffff78;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee8);
  DataStream::operator>>(in_stack_fffffffffffffef8,(uchar *)in_stack_fffffffffffffef0);
  DataStream::operator>>(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  DataStream::operator>>
            (in_stack_fffffffffffffef8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef0);
  *in_RDI = local_21;
  GCSFilter::Params::Params
            ((Params *)in_stack_fffffffffffffef8,(uint64_t)in_stack_fffffffffffffef0,
             (uint64_t)in_stack_fffffffffffffee8,'\0',0x485b9b);
  __e = (io_errc)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  bVar2 = BuildParams(in_stack_ffffffffffffff00,(Params *)in_stack_fffffffffffffef8);
  if (bVar2) {
    this_00 = (GCSFilter *)&stack0xffffffffffffff58;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x485c8c);
    GCSFilter::GCSFilter
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (bool)in_stack_ffffffffffffff67);
    GCSFilter::operator=(this_00,(GCSFilter *)&stack0xffffffffffffff70);
    GCSFilter::~GCSFilter(in_stack_fffffffffffffee8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    pcVar4 = pcVar3;
    std::error_code::error_code<std::io_errc,void>((error_code *)in_stack_fffffffffffffef8,__e);
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s) {
        std::vector<unsigned char> encoded_filter;
        uint8_t filter_type;

        s >> filter_type
          >> m_block_hash
          >> encoded_filter;

        m_filter_type = static_cast<BlockFilterType>(filter_type);

        GCSFilter::Params params;
        if (!BuildParams(params)) {
            throw std::ios_base::failure("unknown filter_type");
        }
        m_filter = GCSFilter(params, std::move(encoded_filter), /*skip_decode_check=*/false);
    }